

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

void cmsys::SystemTools::ConvertToUnixSlashes(string *path)

{
  char cVar1;
  pointer pcVar2;
  char *__s;
  ulong uVar3;
  bool bVar4;
  char *pcVar5;
  passwd *ppVar6;
  size_type pos;
  long lVar7;
  string homeEnv;
  string local_38;
  
  pcVar2 = (path->_M_dataplus)._M_p;
  lVar7 = 0;
  bVar4 = false;
  do {
    if (pcVar2[lVar7] == '\\') {
      if (pcVar2[lVar7 + 1] != ' ') {
        (path->_M_dataplus)._M_p[lVar7] = '/';
      }
    }
    else if (pcVar2[lVar7] == '\0') break;
    if (((pcVar2[lVar7 + 1] == '/') && (pcVar2[lVar7 + 2] == '/')) && (!bVar4)) {
      bVar4 = true;
    }
    lVar7 = lVar7 + 1;
  } while( true );
  if (bVar4) {
    ReplaceString(path,"//","/");
  }
  if (path->_M_string_length == 0) {
    return;
  }
  pcVar5 = (path->_M_dataplus)._M_p;
  if (*pcVar5 == '~') {
    cVar1 = pcVar5[1];
    if ((cVar1 == '/') || (cVar1 == '\0')) {
      local_38._M_string_length = 0;
      local_38.field_2._M_local_buf[0] = '\0';
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      bVar4 = GetEnv("HOME",&local_38);
      if (bVar4) {
        std::__cxx11::string::replace((ulong)path,0,(char *)0x1,(ulong)local_38._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) goto LAB_0010bb24;
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::find_first_of((char *)path,0x1162c0,0);
      std::__cxx11::string::substr((ulong)&local_38,(ulong)path);
      ppVar6 = getpwnam(local_38._M_dataplus._M_p);
      if (ppVar6 != (passwd *)0x0) {
        __s = ppVar6->pw_dir;
        strlen(__s);
        std::__cxx11::string::replace((ulong)path,0,pcVar5,(ulong)__s);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) goto LAB_0010bb24;
    }
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
LAB_0010bb24:
  uVar3 = path->_M_string_length;
  if (((1 < uVar3) && (pcVar2 = (path->_M_dataplus)._M_p, pcVar2[uVar3 - 1] == '/')) &&
     ((uVar3 != 3 || (pcVar2[1] != ':')))) {
    std::__cxx11::string::resize((ulong)path,(char)uVar3 + -1);
  }
  return;
}

Assistant:

void SystemTools::ConvertToUnixSlashes(std::string& path)
{
  const char* pathCString = path.c_str();
  bool hasDoubleSlash = false;
#ifdef __VMS
  ConvertVMSToUnix(path);
#else
  const char* pos0 = pathCString;
  const char* pos1 = pathCString + 1;
  for (std::string::size_type pos = 0; *pos0; ++pos) {
    // make sure we don't convert an escaped space to a unix slash
    if (*pos0 == '\\' && *pos1 != ' ') {
      path[pos] = '/';
    }

    // Also, reuse the loop to check for slash followed by another slash
    if (*pos1 == '/' && *(pos1 + 1) == '/' && !hasDoubleSlash) {
#ifdef _WIN32
      // However, on windows if the first characters are both slashes,
      // then keep them that way, so that network paths can be handled.
      if (pos > 0) {
        hasDoubleSlash = true;
      }
#else
      hasDoubleSlash = true;
#endif
    }

    pos0++;
    pos1++;
  }

  if (hasDoubleSlash) {
    SystemTools::ReplaceString(path, "//", "/");
  }
#endif
  // remove any trailing slash
  if (!path.empty()) {
    // if there is a tilda ~ then replace it with HOME
    pathCString = path.c_str();
    if (pathCString[0] == '~' &&
        (pathCString[1] == '/' || pathCString[1] == '\0')) {
      std::string homeEnv;
      if (SystemTools::GetEnv("HOME", homeEnv)) {
        path.replace(0, 1, homeEnv);
      }
    }
#ifdef HAVE_GETPWNAM
    else if (pathCString[0] == '~') {
      std::string::size_type idx = path.find_first_of("/\0");
      std::string user = path.substr(1, idx - 1);
      passwd* pw = getpwnam(user.c_str());
      if (pw) {
        path.replace(0, idx, pw->pw_dir);
      }
    }
#endif
    // remove trailing slash if the path is more than
    // a single /
    pathCString = path.c_str();
    size_t size = path.size();
    if (size > 1 && *path.rbegin() == '/') {
      // if it is c:/ then do not remove the trailing slash
      if (!((size == 3 && pathCString[1] == ':'))) {
        path.resize(size - 1);
      }
    }
  }
}